

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall
ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
          (basic_fstream<char,_std::char_traits<char>_> *this)

{
  std::ios_base::ios_base
            ((ios_base *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x108);
  *(code **)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x108 =
       std::__basic_file<char>::is_open;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x1e0 = 0;
  *(undefined2 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x1e8 = 0;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x1f0 = 0;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x1f8 = 0;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x200 = 0;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x208 = 0;
  std::fstream::fstream((fstream *)this);
  *(undefined8 *)&this->super_basic_fstream<char,_std::char_traits<char>_> = 0x1beaf8;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x108 = 0x1beb48;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x10 = 0x1beb20;
  return;
}

Assistant:

basic_fstream() {}